

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void plot_all_tiles(tgestate_t *state)

{
  byte x;
  uint8_t *window;
  char cVar1;
  tileindex_t *vistiles;
  supertileindex_t *maptiles;
  
  vistiles = state->tile_buf;
  maptiles = state->map_buf;
  window = state->window_buf;
  x = (state->map_position).x;
  check_map_buf(state);
  cVar1 = (char)state->columns;
  do {
    plot_vertical_tiles_common(state,vistiles,maptiles,x,window);
    vistiles = vistiles + 1;
    x = x + 1;
    maptiles = maptiles + ((x & 3) == 0);
    window = window + 1;
    cVar1 = cVar1 + -1;
  } while (cVar1 != '\0');
  return;
}

Assistant:

void plot_all_tiles(tgestate_t *state)
{
  tileindex_t      *vistiles; /* was DE */
  supertileindex_t *maptiles; /* was HL' */
  uint8_t          *window;   /* was DE' */
  uint8_t           x;        /* was A */
  uint8_t           iters;    /* was B' */

  assert(state != NULL);
  ASSERT_MAP_POSITION_VALID(state->map_position);

  vistiles = &state->tile_buf[0];   /* visible tiles array */
  maptiles = &state->map_buf[0];    /* 7x5 supertile refs */
  window   = &state->window_buf[0]; /* screen buffer start address */
  x        = state->map_position.x; /* map_position x */

  check_map_buf(state);

  iters = state->columns; /* Conv: was 24 */
  do
  {
    plot_vertical_tiles_common(state, vistiles, maptiles, x, window);
    vistiles++;
    x++;
    if ((x & 3) == 0)
      maptiles++;
    window++;
  }
  while (--iters);
}